

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeStartFaces(MeshEdgebreakerTraversalDecoder *this)

{
  bool bVar1;
  uint16_t uVar2;
  uint64_t *puVar3;
  DecoderBuffer *in_RDI;
  uint64_t traversal_size;
  uint64_t *in_stack_ffffffffffffffe8;
  uint64_t *bytes;
  DecoderBuffer *source_buffer;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  source_buffer = in_RDI;
  uVar2 = DecoderBuffer::bitstream_version(in_RDI);
  if (uVar2 < 0x202) {
    memcpy(&in_RDI[2].bit_decoder_,in_RDI,0x34);
    bVar1 = DecoderBuffer::StartBitDecoding
                      ((DecoderBuffer *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       SUB81((ulong)source_buffer >> 0x38,0),in_stack_ffffffffffffffe8);
    if (bVar1) {
      memcpy(in_RDI,&in_RDI[2].bit_decoder_,0x34);
      bytes = in_stack_ffffffffffffffe8;
      puVar3 = (uint64_t *)DecoderBuffer::remaining_size(in_RDI);
      if (puVar3 < in_stack_ffffffffffffffe8) {
        bVar1 = false;
      }
      else {
        DecoderBuffer::Advance(in_RDI,(int64_t)bytes);
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = RAnsBitDecoder::StartDecoding
                      ((RAnsBitDecoder *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),source_buffer);
  }
  return bVar1;
}

Assistant:

bool DecodeStartFaces() {
    // Create a decoder that is set to the end of the encoded traversal data.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (buffer_.bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
      start_face_buffer_ = buffer_;
      uint64_t traversal_size;
      if (!start_face_buffer_.StartBitDecoding(true, &traversal_size)) {
        return false;
      }
      buffer_ = start_face_buffer_;
      if (traversal_size > static_cast<uint64_t>(buffer_.remaining_size())) {
        return false;
      }
      buffer_.Advance(traversal_size);
      return true;
    }
#endif
    return start_face_decoder_.StartDecoding(&buffer_);
  }